

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::processCoreConfigureCommands(CommonCore *this,ActionMessage *cmd)

{
  int iVar1;
  uint uVar2;
  string_view message;
  bool bVar3;
  FederateState *pFVar4;
  int32_t fileLevel;
  int32_t consoleLevel;
  size_t newSize;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *this_00;
  _Any_data *this_01;
  string_view lfile;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  string_view name;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  callback;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type local_a0;
  optional<std::any> locker;
  __shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2> local_68;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = cmd->messageID;
  switch(iVar1) {
  case 0x10f:
    BrokerBase::setLogLevel(&this->super_BrokerBase,(cmd->dest_handle).hid);
    return;
  case 0x110:
    consoleLevel = ((this->super_BrokerBase).mLogManager.
                    super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   consoleLogLevel;
    fileLevel = (cmd->dest_handle).hid;
    break;
  case 0x111:
  case 0x113:
switchD_002922df_caseD_111:
    message._M_str = "unrecognized configure option passed to core ";
    message._M_len = 0x2d;
    name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
    name._M_len = (this->super_BrokerBase).identifier._M_string_length;
    BrokerBase::sendToLogger
              (&this->super_BrokerBase,
               (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,message,
               false);
    return;
  case 0x112:
    consoleLevel = (cmd->dest_handle).hid;
    fileLevel = ((this->super_BrokerBase).mLogManager.
                 super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                fileLogLevel;
    break;
  case 0x114:
    uVar2 = (cmd->dest_handle).hid;
    newSize = 0;
    if (0 < (int)uVar2) {
      newSize = (size_t)uVar2;
    }
    LogBuffer::resize(&((this->super_BrokerBase).mLogManager.
                        super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       mLogBuffer,newSize);
    return;
  default:
    if (iVar1 == 0x1d) {
      (this->super_BrokerBase).no_ping = (bool)((byte)cmd->flags >> 5 & 1);
      return;
    }
    if (iVar1 == 0x1f) {
      bVar3 = (bool)((byte)cmd->flags >> 5 & 1);
      (this->super_BrokerBase).no_ping = bVar3;
      (this->super_BrokerBase).debugging = bVar3;
      return;
    }
    if (iVar1 == 0x252) {
      lfile._M_str = (char *)(cmd->payload).heap;
      lfile._M_len = (cmd->payload).bufferSize;
      BrokerBase::setLoggingFile(&this->super_BrokerBase,lfile);
      return;
    }
    if (iVar1 == 0x48) {
      (this->super_BrokerBase).terminate_on_error = (bool)((byte)cmd->flags >> 5 & 1);
      return;
    }
    if (iVar1 == 0x6d) {
      (this->super_BrokerBase).allowRemoteControl = (bool)((byte)cmd->flags >> 5 & 1);
      return;
    }
    if (iVar1 == 0x6e) {
      (this->super_BrokerBase).allowRemoteControl = (cmd->flags & 0x20) == 0;
      return;
    }
    if (iVar1 == 0x23c) {
      if (this->filterFed == (FilterFederate *)0x0) {
        return;
      }
      FilterFederate::handleMessage(this->filterFed,cmd);
      return;
    }
    if (iVar1 == 0x23e) {
      if (this->translatorFed == (TranslatorFederate *)0x0) {
        return;
      }
      TranslatorFederate::handleMessage(this->translatorFed,cmd);
      return;
    }
    if (iVar1 == 0x240) {
      if ((short)cmd->flags < 0) {
        local_48 = 0;
        uStack_40 = 0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        BrokerBase::setLoggerFunction
                  (&this->super_BrokerBase,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_58);
        this_01 = &local_58;
LAB_00292630:
        CLI::std::_Function_base::~_Function_base((_Function_base *)this_01);
        return;
      }
      gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                ((optional<std::any> *)&callback,
                 (AirLock<std::any,_std::mutex,_std::condition_variable> *)
                 &(this->dataAirlocks)._M_elems[cmd->counter].loaded);
      if (((char)callback.super__Function_base._M_manager == '\x01') &&
         (pFVar4 = getFederateCore(this,(GlobalFederateId)(cmd->source_id).gid),
         pFVar4 != (FederateState *)0x0)) {
        std::any_cast<std::shared_ptr<helics::FederateOperator>>((any *)&locker);
        local_68._M_ptr =
             (element_type *)
             locker.super__Optional_base<std::any,_false,_false>._M_payload.
             super__Optional_payload<std::any,_true,_false,_false>.
             super__Optional_payload_base<std::any>._M_payload._M_value._M_manager;
        local_68._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             locker.super__Optional_base<std::any,_false,_false>._M_payload.
             super__Optional_payload<std::any,_true,_false,_false>.
             super__Optional_payload_base<std::any>._M_payload._M_value._M_storage;
        locker.super__Optional_base<std::any,_false,_false>._M_payload.
        super__Optional_payload<std::any,_true,_false,_false>.super__Optional_payload_base<std::any>
        ._M_payload._M_value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        locker.super__Optional_base<std::any,_false,_false>._M_payload.
        super__Optional_payload<std::any,_true,_false,_false>.super__Optional_payload_base<std::any>
        ._M_payload._M_value._M_storage = (_Storage)0x0;
        std::__shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pFVar4->fedCallbacks).
                    super___shared_ptr<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2>,
                   &local_68);
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount)
        ;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &locker.super__Optional_base<std::any,_false,_false>._M_payload.
                    super__Optional_payload<std::any,_true,_false,_false>.
                    super__Optional_payload_base<std::any>._M_payload._M_value._M_storage);
      }
      this_00 = &callback;
    }
    else {
      if (iVar1 != 0x250) {
        if (iVar1 == 0x2f) {
          LOCK();
          (this->delayInitCounter).super___atomic_base<short>._M_i =
               (this->delayInitCounter).super___atomic_base<short>._M_i + -1;
          UNLOCK();
          if (0 < (this->delayInitCounter).super___atomic_base<short>._M_i) {
            return;
          }
          bVar3 = allInitReady(this);
          if (!bVar3) {
            return;
          }
          bVar3 = BrokerBase::transitionBrokerState(&this->super_BrokerBase,CONNECTED,INITIALIZING);
          if (!bVar3) {
            return;
          }
          checkDependencies(this);
          ActionMessage::setAction(cmd,cmd_init);
          (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
          (cmd->dest_id).gid = 0;
          (*(this->super_Core)._vptr_Core[0x6b])(this,0,cmd);
          return;
        }
        goto switchD_002922df_caseD_111;
      }
      if ((short)cmd->flags < 0) {
        local_28 = 0;
        uStack_20 = 0;
        local_38._M_unused._M_object = (void *)0x0;
        local_38._8_8_ = 0;
        BrokerBase::setLoggerFunction
                  (&this->super_BrokerBase,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_38);
        this_01 = &local_38;
        goto LAB_00292630;
      }
      gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                (&locker,(AirLock<std::any,_std::mutex,_std::condition_variable> *)
                         &(this->dataAirlocks)._M_elems[cmd->counter].loaded);
      if (locker.super__Optional_base<std::any,_false,_false>._M_payload.
          super__Optional_payload<std::any,_true,_false,_false>.
          super__Optional_payload_base<std::any>._M_engaged == true) {
        std::
        any_cast<std::function<void(int,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>>
                  (&callback,(any *)&locker);
        __args_1._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        __args_1._M_len = (this->super_BrokerBase).identifier._M_string_length;
        __args_2._M_str = "logging callback activated";
        __args_2._M_len = 0x1a;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&callback,0,__args_1,__args_2);
        local_b8._M_unused._M_object = (void *)0x0;
        local_b8._8_8_ = 0;
        local_a8 = (_Manager_type)0x0;
        local_a0 = callback._M_invoker;
        if (callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          local_b8._M_unused._M_object =
               callback.super__Function_base._M_functor._M_unused._M_object;
          local_b8._8_8_ = callback.super__Function_base._M_functor._8_8_;
          local_a8 = callback.super__Function_base._M_manager;
          callback.super__Function_base._M_manager = (_Manager_type)0x0;
          callback._M_invoker = (_Invoker_type)0x0;
        }
        BrokerBase::setLoggerFunction
                  (&this->super_BrokerBase,
                   (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)&local_b8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
        CLI::std::_Function_base::~_Function_base((_Function_base *)&callback);
      }
      this_00 = (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                 *)&locker;
    }
    std::_Optional_payload_base<std::any>::_M_reset((_Optional_payload_base<std::any> *)this_00);
    return;
  }
  BrokerBase::setLogLevels(&this->super_BrokerBase,consoleLevel,fileLevel);
  return;
}

Assistant:

void CommonCore::processCoreConfigureCommands(ActionMessage& cmd)
{
    switch (cmd.messageID) {
        case defs::Flags::ENABLE_INIT_ENTRY:
            --delayInitCounter;
            if (delayInitCounter <= 0) {
                if (allInitReady()) {
                    if (transitionBrokerState(
                            BrokerState::CONNECTED,
                            BrokerState::INITIALIZING)) {  // make sure we only do this once
                        checkDependencies();
                        cmd.setAction(CMD_INIT);
                        cmd.source_id = global_broker_id_local;
                        cmd.dest_id = parent_broker_id;
                        transmit(parent_route_id, cmd);
                    }
                }
            }
            break;
        case defs::Properties::LOG_LEVEL:
            setLogLevel(cmd.getExtraData());
            break;
        case defs::Properties::FILE_LOG_LEVEL:
            setLogLevels(mLogManager->getConsoleLevel(), cmd.getExtraData());
            break;
        case defs::Properties::CONSOLE_LOG_LEVEL:
            setLogLevels(cmd.getExtraData(), mLogManager->getFileLevel());
            break;
        case defs::Properties::LOG_BUFFER: {
            auto size = cmd.getExtraData();
            mLogManager->getLogBuffer().resize((size <= 0) ? 0UL : static_cast<std::size_t>(size));
        }

        break;
        case defs::Flags::ALLOW_REMOTE_CONTROL:
            allowRemoteControl = checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::DISABLE_REMOTE_CONTROL:
            allowRemoteControl = !checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::TERMINATE_ON_ERROR:
            terminate_on_error = checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::SLOW_RESPONDING:
            no_ping = checkActionFlag(cmd, indicator_flag);
            break;
        case defs::Flags::DEBUGGING:
            debugging = no_ping = checkActionFlag(cmd, indicator_flag);
            break;
        case UPDATE_LOGGING_CALLBACK:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto callback = std::any_cast<
                            std::function<void(int, std::string_view, std::string_view)>>(
                            std::move(*locker));
                        callback(0, identifier, "logging callback activated");
                        setLoggerFunction(std::move(callback));
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                    }
                }
            }
            break;
        case UPDATE_LOGGING_FILE:
            setLoggingFile(cmd.payload.to_string());
            break;
        case UPDATE_FILTER_OPERATOR:
            if (filterFed != nullptr) {
                filterFed->handleMessage(cmd);
            }
            break;
        case UPDATE_TRANSLATOR_OPERATOR:
            if (translatorFed != nullptr) {
                translatorFed->handleMessage(cmd);
            }
            break;
        case UPDATE_FEDERATE_OPERATOR:
            if (checkActionFlag(cmd, empty_flag)) {
                setLoggerFunction(nullptr);
            } else {
                auto locker = dataAirlocks[cmd.counter].try_unload();
                if (locker) {
                    try {
                        auto* fed = getFederateCore(cmd.source_id);
                        if (fed != nullptr) {
                            auto fedop = std::any_cast<std::shared_ptr<FederateOperator>>(
                                std::move(*locker));
                            fed->setCallbackOperator(std::move(fedop));
                        }
                    }
                    catch (const std::bad_any_cast&) {
                        // This shouldn't really happen unless someone is being malicious so just
                        // ignore it for now.
                    }
                }
            }
            break;
        default:
            LOG_WARNING(global_broker_id_local,
                        identifier,
                        "unrecognized configure option passed to core ");
            break;
    }
}